

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ringbuffer.h
# Opt level: O0

void __thiscall brotli::RingBuffer::RingBuffer(RingBuffer *this,int window_bits,int tail_bits)

{
  ulong uVar1;
  uint8_t *puVar2;
  ulong local_28;
  size_t i;
  size_t buflen;
  int tail_bits_local;
  int window_bits_local;
  RingBuffer *this_local;
  
  this->size_ = 1 << ((byte)window_bits & 0x1f);
  this->mask_ = (1 << ((byte)window_bits & 0x1f)) - 1;
  this->tail_size_ = 1 << ((byte)tail_bits & 0x1f);
  this->pos_ = 0;
  uVar1 = (ulong)(this->size_ + this->tail_size_);
  puVar2 = (uint8_t *)operator_new__(uVar1 + 9);
  this->data_ = puVar2;
  this->buffer_ = this->data_ + 2;
  for (local_28 = 0; local_28 < 7; local_28 = local_28 + 1) {
    this->buffer_[uVar1 + local_28] = '\0';
  }
  this->buffer_[this->size_ - 2] = '\0';
  this->buffer_[-2] = '\0';
  this->buffer_[this->size_ - 1] = '\0';
  this->buffer_[-1] = '\0';
  return;
}

Assistant:

RingBuffer(int window_bits, int tail_bits)
      : size_(1u << window_bits),
        mask_((1u << window_bits) - 1),
        tail_size_(1u << tail_bits),
        pos_(0) {
    static const size_t kSlackForEightByteHashingEverywhere = 7;
    const size_t buflen = size_ + tail_size_;
    data_ = new uint8_t[2 + buflen + kSlackForEightByteHashingEverywhere];
    buffer_ = data_ + 2;
    for (size_t i = 0; i < kSlackForEightByteHashingEverywhere; ++i) {
      buffer_[buflen + i] = 0;
    }
    // Initialize the last two bytes and their copy to zero.
    buffer_[-2] = buffer_[size_ - 2] = 0;
    buffer_[-1] = buffer_[size_ - 1] = 0;
  }